

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_jxx(TCGContext_conflict9 *s,int opc,TCGLabel *l,int _small)

{
  uint8_t v;
  int iVar1;
  ptrdiff_t pVar2;
  int32_t val1;
  int32_t val;
  int _small_local;
  TCGLabel *l_local;
  int opc_local;
  TCGContext_conflict9 *s_local;
  
  if ((*(uint *)l >> 1 & 1) == 0) {
    if (_small == 0) {
      if (opc == -1) {
        tcg_out8(s,0xe9);
      }
      else {
        tcg_out_opc(s,opc + 0x180,0,0,0);
      }
      tcg_out_reloc(s,s->code_ptr,2,l,-4);
      s->code_ptr = s->code_ptr + 4;
    }
    else {
      if (opc == -1) {
        tcg_out8(s,0xeb);
      }
      else {
        tcg_out8(s,(char)opc + 'p');
      }
      tcg_out_reloc(s,s->code_ptr,0x17,l,-1);
      s->code_ptr = s->code_ptr + 1;
    }
  }
  else {
    pVar2 = tcg_pcrel_diff(s,(l->u).value_ptr);
    iVar1 = (int)pVar2;
    v = (uint8_t)(iVar1 + -2);
    if ((int)(char)v == iVar1 + -2) {
      if (opc == -1) {
        tcg_out8(s,0xeb);
      }
      else {
        tcg_out8(s,(char)opc + 'p');
      }
      tcg_out8(s,v);
    }
    else {
      if (_small != 0) {
        fprintf(_stderr,"%s:%d: tcg fatal error\n",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                ,0x532);
        abort();
      }
      if (opc == -1) {
        tcg_out8(s,0xe9);
        tcg_out32(s,iVar1 - 5);
      }
      else {
        tcg_out_opc(s,opc + 0x180,0,0,0);
        tcg_out32(s,iVar1 - 6);
      }
    }
  }
  return;
}

Assistant:

static void tcg_out_jxx(TCGContext *s, int opc, TCGLabel *l, int _small)
{
    int32_t val, val1;

    if (l->has_value) {
        val = tcg_pcrel_diff(s, l->u.value_ptr);
        val1 = val - 2;
        if ((int8_t)val1 == val1) {
            if (opc == -1) {
                tcg_out8(s, OPC_JMP_short);
            } else {
                tcg_out8(s, OPC_JCC_short + opc);
            }
            tcg_out8(s, val1);
        } else {
            if (_small) {
                tcg_abort();
            }
            if (opc == -1) {
                tcg_out8(s, OPC_JMP_long);
                tcg_out32(s, val - 5);
            } else {
                tcg_out_opc(s, OPC_JCC_long + opc, 0, 0, 0);
                tcg_out32(s, val - 6);
            }
        }
    } else if (_small) {
        if (opc == -1) {
            tcg_out8(s, OPC_JMP_short);
        } else {
            tcg_out8(s, OPC_JCC_short + opc);
        }
        tcg_out_reloc(s, s->code_ptr, R_386_PC8, l, -1);
        s->code_ptr += 1;
    } else {
        if (opc == -1) {
            tcg_out8(s, OPC_JMP_long);
        } else {
            tcg_out_opc(s, OPC_JCC_long + opc, 0, 0, 0);
        }
        tcg_out_reloc(s, s->code_ptr, R_386_PC32, l, -4);
        s->code_ptr += 4;
    }
}